

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  String local_38;
  
  lVar1 = *(long *)wstr;
  lVar2 = *(long *)(wstr + 8);
  lVar3 = 0;
  while (lVar4 = lVar3, lVar2 != lVar4) {
    if (*(int *)(lVar1 + lVar4 * 4) == 0) {
      local_38.c_str_._0_1_ = 0;
      operator<<(this,(char *)&local_38);
      lVar3 = lVar4 + 1;
    }
    else {
      internal::WideStringToUtf8
                ((internal *)&local_38,(wchar_t *)(lVar1 + lVar4 * 4),(int)lVar2 - (int)lVar4);
      operator<<(this,&local_38);
      internal::String::~String(&local_38);
      for (; (lVar3 = lVar2, lVar2 != lVar4 && (lVar3 = lVar4, *(int *)(lVar1 + lVar4 * 4) != 0));
          lVar4 = lVar4 + 1) {
      }
    }
  }
  return this;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}